

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void __thiscall RtApi::clearStreamInfo(RtApi *this)

{
  int local_14;
  int i;
  RtApi *this_local;
  
  (this->stream_).mode = UNINITIALIZED;
  (this->stream_).state = STREAM_CLOSED;
  (this->stream_).sampleRate = 0;
  (this->stream_).bufferSize = 0;
  (this->stream_).nBuffers = 0;
  (this->stream_).userFormat = 0;
  (this->stream_).userInterleaved = true;
  (this->stream_).streamTime = 0.0;
  (this->stream_).apiHandle = (void *)0x0;
  (this->stream_).deviceBuffer = (char *)0x0;
  (this->stream_).callbackInfo.callback = (void *)0x0;
  (this->stream_).callbackInfo.userData = (void *)0x0;
  (this->stream_).callbackInfo.isRunning = false;
  (this->stream_).callbackInfo.deviceDisconnected = false;
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    (this->stream_).deviceId[local_14] = 0x2b67;
    (this->stream_).doConvertBuffer[local_14] = false;
    (this->stream_).deviceInterleaved[local_14] = true;
    (this->stream_).doByteSwap[local_14] = false;
    (this->stream_).nUserChannels[local_14] = 0;
    (this->stream_).nDeviceChannels[local_14] = 0;
    (this->stream_).channelOffset[local_14] = 0;
    (this->stream_).deviceFormat[local_14] = 0;
    (this->stream_).latency[local_14] = 0;
    (this->stream_).userBuffer[local_14] = (char *)0x0;
    (this->stream_).convertInfo[local_14].channels = 0;
    (this->stream_).convertInfo[local_14].inJump = 0;
    (this->stream_).convertInfo[local_14].outJump = 0;
    (this->stream_).convertInfo[local_14].inFormat = 0;
    (this->stream_).convertInfo[local_14].outFormat = 0;
    std::vector<int,_std::allocator<int>_>::clear(&(this->stream_).convertInfo[local_14].inOffset);
    std::vector<int,_std::allocator<int>_>::clear(&(this->stream_).convertInfo[local_14].outOffset);
  }
  return;
}

Assistant:

void RtApi :: clearStreamInfo()
{
  stream_.mode = UNINITIALIZED;
  stream_.state = STREAM_CLOSED;
  stream_.sampleRate = 0;
  stream_.bufferSize = 0;
  stream_.nBuffers = 0;
  stream_.userFormat = 0;
  stream_.userInterleaved = true;
  stream_.streamTime = 0.0;
  stream_.apiHandle = 0;
  stream_.deviceBuffer = 0;
  stream_.callbackInfo.callback = 0;
  stream_.callbackInfo.userData = 0;
  stream_.callbackInfo.isRunning = false;
  stream_.callbackInfo.deviceDisconnected = false;
  for ( int i=0; i<2; i++ ) {
    stream_.deviceId[i] = 11111;
    stream_.doConvertBuffer[i] = false;
    stream_.deviceInterleaved[i] = true;
    stream_.doByteSwap[i] = false;
    stream_.nUserChannels[i] = 0;
    stream_.nDeviceChannels[i] = 0;
    stream_.channelOffset[i] = 0;
    stream_.deviceFormat[i] = 0;
    stream_.latency[i] = 0;
    stream_.userBuffer[i] = 0;
    stream_.convertInfo[i].channels = 0;
    stream_.convertInfo[i].inJump = 0;
    stream_.convertInfo[i].outJump = 0;
    stream_.convertInfo[i].inFormat = 0;
    stream_.convertInfo[i].outFormat = 0;
    stream_.convertInfo[i].inOffset.clear();
    stream_.convertInfo[i].outOffset.clear();
  }
}